

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O0

int syms_inc_scope(void)

{
  size_t in_RAX;
  symtbl_t **ppsVar1;
  symtbl_t *psVar2;
  symtbl_t *new;
  
  scope->num_children = scope->num_children + 1;
  ppsVar1 = (symtbl_t **)mrealloc(new,in_RAX);
  scope->children = ppsVar1;
  psVar2 = (symtbl_t *)mmalloc((size_t)new);
  scope_id = scope_id + 1;
  cur_scope_id = scope_id;
  psVar2->scope_id = scope_id;
  psVar2->parent = scope;
  psVar2->num_syms = 0;
  psVar2->num_children = 0;
  psVar2->syms = (sym_t **)0x0;
  psVar2->children = (symtbl_t **)0x0;
  scope->children[scope->num_children - 1] = psVar2;
  scope = psVar2;
  return cur_scope_id;
}

Assistant:

int syms_inc_scope()
{
    symtbl_t* new;
    scope->num_children++;
    scope->children = (symtbl_t**)mrealloc(scope->children,
                                           sizeof(symtbl_t*) * scope->num_children);
    new = (symtbl_t*)mmalloc(sizeof(symtbl_t));

    ++scope_id;
    cur_scope_id = scope_id;

    new->scope_id = scope_id;
    new->parent = scope;
    new->num_syms = 0;
    new->num_children = 0;
    new->syms = NULL;
    new->children = NULL;

    scope->children[scope->num_children - 1] = new;
    scope = new;

    return cur_scope_id;
}